

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_clump.c
# Opt level: O0

REF_STATUS
ref_clump_cell_zone(FILE *f,REF_CELL ref_cell,REF_DICT ref_dict,char *zonetype,REF_NODE ref_node)

{
  uint uVar1;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_DICT node_dict;
  REF_INT local_b8;
  REF_INT local;
  REF_INT nodes [27];
  int local_44;
  REF_INT cell_node;
  REF_INT cell;
  REF_INT item;
  REF_NODE ref_node_local;
  char *zonetype_local;
  REF_DICT ref_dict_local;
  REF_CELL ref_cell_local;
  FILE *f_local;
  
  if (ref_dict->n < 1) {
    f_local._4_4_ = 0;
  }
  else {
    f_local._4_4_ = ref_dict_create((REF_DICT *)&ref_private_macro_code_rss_1);
    if (f_local._4_4_ == 0) {
      for (cell_node = 0; cell_node < ref_dict->n; cell_node = cell_node + 1) {
        uVar1 = ref_cell_nodes(ref_cell,ref_dict->key[cell_node],&local_b8);
        if (uVar1 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_clump.c",
                 0x5d,"ref_clump_cell_zone",(ulong)uVar1,"n");
          return uVar1;
        }
        for (local_44 = 0; local_44 < ref_cell->node_per; local_44 = local_44 + 1) {
          uVar1 = ref_dict_store(_ref_private_macro_code_rss_1,(&local_b8)[local_44],0);
          if (uVar1 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_clump.c"
                   ,0x5f,"ref_clump_cell_zone",(ulong)uVar1,"store");
            return uVar1;
          }
        }
      }
      fprintf((FILE *)f,"zone t=\"%s\", nodes=%d, elements=%d, datapacking=%s, zonetype=%s\n",
              zonetype,(ulong)(uint)_ref_private_macro_code_rss_1->n,(ulong)(uint)ref_dict->n,
              "point",zonetype);
      for (cell_node = 0; cell_node < _ref_private_macro_code_rss_1->n; cell_node = cell_node + 1) {
        node_dict._4_4_ = _ref_private_macro_code_rss_1->key[cell_node];
        fprintf((FILE *)f," %.16e %.16e %.16e\n",ref_node->real[node_dict._4_4_ * 0xf],
                ref_node->real[node_dict._4_4_ * 0xf + 1],ref_node->real[node_dict._4_4_ * 0xf + 2])
        ;
      }
      for (cell_node = 0; cell_node < ref_dict->n; cell_node = cell_node + 1) {
        uVar1 = ref_cell_nodes(ref_cell,ref_dict->key[cell_node],&local_b8);
        if (uVar1 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_clump.c",
                 0x6f,"ref_clump_cell_zone",(ulong)uVar1,"n");
          return uVar1;
        }
        for (local_44 = 0; local_44 < ref_cell->node_per; local_44 = local_44 + 1) {
          uVar1 = ref_dict_location(_ref_private_macro_code_rss_1,(&local_b8)[local_44],
                                    (REF_INT *)((long)&node_dict + 4));
          if (uVar1 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_clump.c"
                   ,0x71,"ref_clump_cell_zone",(ulong)uVar1,"ret");
            return uVar1;
          }
          fprintf((FILE *)f," %d",(ulong)(node_dict._4_4_ + 1));
        }
        fprintf((FILE *)f,"\n");
      }
      f_local._4_4_ = 0;
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_clump.c",0x5a,
             "ref_clump_cell_zone",(ulong)f_local._4_4_,"create cell dict");
    }
  }
  return f_local._4_4_;
}

Assistant:

REF_FCN static REF_STATUS ref_clump_cell_zone(FILE *f, REF_CELL ref_cell,
                                              REF_DICT ref_dict,
                                              const char *zonetype,
                                              REF_NODE ref_node) {
  REF_INT item, cell, cell_node;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT local;
  REF_DICT node_dict;

  if (ref_dict_n(ref_dict) <= 0) return REF_SUCCESS;

  RSS(ref_dict_create(&node_dict), "create cell dict");
  for (item = 0; item < ref_dict_n(ref_dict); item++) {
    cell = ref_dict_key(ref_dict, item);
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "n");
    each_ref_cell_cell_node(ref_cell, cell_node) {
      RSS(ref_dict_store(node_dict, nodes[cell_node], 0), "store");
    }
  }

  fprintf(
      f, "zone t=\"%s\", nodes=%d, elements=%d, datapacking=%s, zonetype=%s\n",
      zonetype, ref_dict_n(node_dict), ref_dict_n(ref_dict), "point", zonetype);

  for (item = 0; item < ref_dict_n(node_dict); item++) {
    local = ref_dict_key(node_dict, item);
    fprintf(f, " %.16e %.16e %.16e\n", ref_node_xyz(ref_node, 0, local),
            ref_node_xyz(ref_node, 1, local), ref_node_xyz(ref_node, 2, local));
  }

  for (item = 0; item < ref_dict_n(ref_dict); item++) {
    cell = ref_dict_key(ref_dict, item);
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "n");
    each_ref_cell_cell_node(ref_cell, cell_node) {
      RSS(ref_dict_location(node_dict, nodes[cell_node], &local), "ret");
      fprintf(f, " %d", local + 1);
    }
    fprintf(f, "\n");
  }

  return REF_SUCCESS;
}